

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O3

void __thiscall SubprocessTestInterruptChild::Run(SubprocessTestInterruptChild *this)

{
  Test *this_00;
  bool bVar1;
  ExitStatus EVar2;
  Subprocess *this_01;
  SubprocessSet *this_02;
  string local_38;
  
  this_02 = &(this->super_SubprocessTest).subprocs_;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"kill -INT $$","");
  this_01 = SubprocessSet::Add(this_02,&local_38,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  bVar1 = testing::Test::Check
                    (g_current_test,this_01 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x4f,"(Subprocess *) 0 != subproc");
  if (bVar1) {
    while( true ) {
      bVar1 = Subprocess::Done(this_01);
      this_00 = g_current_test;
      if (bVar1) break;
      SubprocessSet::DoWork(this_02);
    }
    EVar2 = Subprocess::Finish(this_01);
    testing::Test::Check
              (this_00,EVar2 == ExitInterrupted,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
               ,0x55,"ExitInterrupted == subproc->Finish()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptChild) {
  Subprocess* subproc = subprocs_.Add("kill -INT $$");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    subprocs_.DoWork();
  }

  EXPECT_EQ(ExitInterrupted, subproc->Finish());
}